

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetSourceFilePaths
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  pointer pcVar1;
  size_type sVar2;
  cmGeneratorTarget *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  TargetType TVar8;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var9;
  cmLinkImplementationLibraries *pcVar10;
  string *psVar11;
  cmFileSet *pcVar12;
  Tribool TVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  _Alloc_hider _Var14;
  string *item;
  cmGeneratorTarget *__args;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  *p_Var15;
  string_view str;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  cmBTStringRange cVar16;
  cmBTStringRange cVar17;
  cmBTStringRange cVar18;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2b0;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string uniqueName;
  EvaluatedTargetPropertyEntries fileSetEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_218;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  cmGeneratorExpression ge;
  EvaluatedTargetPropertyEntries linkObjectsEntries;
  string local_1b8;
  EvaluatedTargetPropertyEntries linkInterfaceSourcesEntries;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_178;
  string genex;
  cmGeneratorExpressionDAGChecker dagChecker;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueSrcs;
  EvaluatedTargetPropertyEntries entries;
  string local_70;
  string local_50 [32];
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->LocalGenerator->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == false) {
    cVar16 = cmTarget::GetSourceEntries_abi_cxx11_(this->Target);
    for (_Var9 = cVar16.Begin._M_current; _Var9._M_current != cVar16.End._M_current._M_current;
        _Var9._M_current = _Var9._M_current + 1) {
      arg_00._M_str = ((_Var9._M_current)->Value)._M_dataplus._M_p;
      arg_00._M_len = ((_Var9._M_current)->Value)._M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&dagChecker,arg_00,false);
      pcVar3 = dagChecker.Target;
      for (__args = (cmGeneratorTarget *)dagChecker.Parent; __args != pcVar3;
          __args = (cmGeneratorTarget *)&__args->ObjectDirectory) {
        str._M_str = ((_Alloc_hider *)&__args->Target)->_M_p;
        str._M_len = (size_t)__args->Makefile;
        bVar7 = cmHasLiteralPrefix<18ul>(str,(char (*) [18])"$<TARGET_OBJECTS:");
        if ((!bVar7) ||
           ((((_Alloc_hider *)&__args->Target)->_M_p + -1)[(long)__args->Makefile] != '>')) {
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&dagChecker);
    }
  }
  else {
    debugProperties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    debugProperties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    debugProperties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dagChecker,"CMAKE_DEBUG_TARGET_PROPERTIES",
               (allocator<char> *)&fileSetEntries);
    cmMakefile::GetDefExpandList(this_00,(string *)&dagChecker,&debugProperties,false);
    std::__cxx11::string::~string((string *)&dagChecker);
    if (this->DebugSourcesDone == false) {
      bVar7 = ::cm::
              contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[8],_0>
                        (&debugProperties,(char (*) [8])0x5c3827);
    }
    else {
      bVar7 = false;
    }
    if (this->LocalGenerator->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
      this->DebugSourcesDone = true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"SOURCES",(allocator<char> *)&fileSetEntries);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,this,&local_70,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_70);
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&fileSetEntries.Entries.
                   super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    anon_unknown.dwarf_10fe8b8::EvaluateTargetPropertyEntries
              (&entries,this,config,(string *)&fileSetEntries,&dagChecker,&this->SourceEntries);
    std::__cxx11::string::~string((string *)&fileSetEntries);
    uniqueSrcs._M_h._M_buckets = &uniqueSrcs._M_h._M_single_bucket;
    uniqueSrcs._M_h._M_bucket_count = 1;
    uniqueSrcs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    uniqueSrcs._M_h._M_element_count = 0;
    uniqueSrcs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    uniqueSrcs._M_h._M_rehash_policy._M_next_resize = 0;
    uniqueSrcs._M_h._M_single_bucket = (__node_base_ptr)0x0;
    bVar4 = anon_unknown.dwarf_10fe8b8::processSources
                      (this,&entries,__return_storage_ptr__,&uniqueSrcs,bVar7);
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    linkInterfaceSourcesEntries._17_8_ = 0;
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fileSetEntries,"INTERFACE_SOURCES",(allocator<char> *)&genex);
    uniqueName._M_dataplus._M_p = (pointer)&uniqueName.field_2;
    uniqueName._M_string_length = 0;
    uniqueName.field_2._M_local_buf[0] = '\0';
    anon_unknown.dwarf_10fe8b8::AddInterfaceEntries
              (this,config,(string *)&fileSetEntries,&uniqueName,&dagChecker,
               &linkInterfaceSourcesEntries,No,Usage);
    std::__cxx11::string::~string((string *)&uniqueName);
    std::__cxx11::string::~string((string *)&fileSetEntries);
    local_1f0 = (long)(__return_storage_ptr__->
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(__return_storage_ptr__->
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    bVar5 = anon_unknown.dwarf_10fe8b8::processSources
                      (this,&linkInterfaceSourcesEntries,__return_storage_ptr__,&uniqueSrcs,bVar7);
    local_1f8 = (long)(__return_storage_ptr__->
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(__return_storage_ptr__->
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    TVar8 = GetType(this);
    if (TVar8 == OBJECT_LIBRARY) {
      bVar6 = false;
    }
    else {
      linkObjectsEntries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      linkObjectsEntries._17_8_ = 0;
      linkObjectsEntries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      linkObjectsEntries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      linkObjectsEntries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      pcVar10 = GetLinkImplementationLibraries(this,config,Usage);
      if (pcVar10 != (cmLinkImplementationLibraries *)0x0) {
        linkObjectsEntries.HadContextSensitiveCondition = pcVar10->HadContextSensitiveCondition;
        pcVar1 = (pcVar10->Libraries).
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (p_Var15 = (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        *)&(((pcVar10->Libraries).
                             super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
                             _M_impl.super__Vector_impl_data._M_start)->super_cmLinkItem).Backtrace;
            (pointer)(p_Var15 + -3) != pcVar1;
            p_Var15 = (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       *)&p_Var15[4]._M_refcount) {
          if (((cmGeneratorTarget *)p_Var15[-1]._M_ptr != (cmGeneratorTarget *)0x0) &&
             (TVar8 = GetType((cmGeneratorTarget *)p_Var15[-1]._M_ptr), TVar8 == OBJECT_LIBRARY)) {
            cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_
                      (&uniqueName,this->LocalGenerator->GlobalGenerator,
                       (cmGeneratorTarget *)p_Var15[-1]._M_ptr);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &fileSetEntries,"$<TARGET_OBJECTS:",&uniqueName);
            std::operator+(&genex,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&fileSetEntries,">");
            std::__cxx11::string::~string((string *)&fileSetEntries);
            std::
            __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ::__shared_ptr(&local_178,p_Var15);
            cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&local_178);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178._M_refcount)
            ;
            std::__cxx11::string::string(local_50,(string *)&genex);
            cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
            std::__cxx11::string::~string(local_50);
            *(undefined1 *)
             ((long)cge._M_t.
                    super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl +
             0x49) = 1;
            std::
            __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ::__shared_ptr(&local_218,p_Var15);
            fileSetEntries.Entries.
            super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_1_ = SUB81(local_218._M_ptr,0);
            fileSetEntries.Entries.
            super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                 (undefined7)((ulong)local_218._M_ptr >> 8);
            fileSetEntries.Entries.
            super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ =
                 SUB81(local_218._M_refcount._M_pi,0);
            fileSetEntries.Entries.
            super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ =
                 (undefined7)((ulong)local_218._M_refcount._M_pi >> 8);
            local_218._M_ptr = (element_type *)0x0;
            local_218._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            fileSetEntries.HadContextSensitiveCondition = false;
            fileSetEntries._25_7_ = 0;
            fileSetEntries.Entries.
            super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)(p_Var15 + -3);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount)
            ;
            local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            local_1b8._M_string_length = 0;
            local_1b8.field_2._M_local_buf[0] = '\0';
            psVar11 = cmCompiledGeneratorExpression::Evaluate
                                ((cmCompiledGeneratorExpression *)
                                 cge._M_t.
                                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                 _M_head_impl,this->LocalGenerator,config,this,&dagChecker,
                                 (cmGeneratorTarget *)0x0,&local_1b8);
            arg._M_str = (psVar11->_M_dataplus)._M_p;
            arg._M_len = psVar11->_M_string_length;
            cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&fileSetEntries.HadContextSensitiveCondition,false);
            std::__cxx11::string::~string((string *)&local_1b8);
            std::
            vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
            ::emplace_back<(anonymous_namespace)::EvaluatedTargetPropertyEntry>
                      (&linkObjectsEntries.Entries,(EvaluatedTargetPropertyEntry *)&fileSetEntries);
            anon_unknown.dwarf_10fe8b8::EvaluatedTargetPropertyEntry::~EvaluatedTargetPropertyEntry
                      ((EvaluatedTargetPropertyEntry *)&fileSetEntries);
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr(&cge);
            cmGeneratorExpression::~cmGeneratorExpression(&ge);
            std::__cxx11::string::~string((string *)&genex);
            std::__cxx11::string::~string((string *)&uniqueName);
          }
        }
      }
      bVar6 = anon_unknown.dwarf_10fe8b8::processSources
                        (this,&linkObjectsEntries,__return_storage_ptr__,&uniqueSrcs,bVar7);
      anon_unknown.dwarf_10fe8b8::EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
                (&linkObjectsEntries);
    }
    local_200 = (long)(__return_storage_ptr__->
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(__return_storage_ptr__->
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    fileSetEntries.HadContextSensitiveCondition = false;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    cVar16 = cmTarget::GetHeaderSetsEntries_abi_cxx11_(this->Target);
    while( true ) {
      local_2b0 = cVar16.End._M_current;
      _Var9 = cVar16.Begin._M_current;
      if (_Var9._M_current == local_2b0._M_current) break;
      arg_01._M_str = ((_Var9._M_current)->Value)._M_dataplus._M_p;
      arg_01._M_len = ((_Var9._M_current)->Value)._M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&uniqueName,arg_01,false);
      sVar2 = uniqueName._M_string_length;
      for (_Var14 = uniqueName._M_dataplus; _Var14._M_p != (pointer)sVar2;
          _Var14._M_p = _Var14._M_p + 0x20) {
        pcVar12 = cmTarget::GetFileSet(this->Target,(string *)_Var14._M_p);
        anon_unknown.dwarf_10fe8b8::addFileSetEntry(this,config,&dagChecker,pcVar12,&fileSetEntries)
        ;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&uniqueName);
      cVar16.End._M_current = local_2b0._M_current;
      cVar16.Begin._M_current = _Var9._M_current + 1;
    }
    cVar17 = cmTarget::GetCxxModuleSetsEntries_abi_cxx11_(this->Target);
    while( true ) {
      local_2b0 = cVar17.End._M_current;
      _Var9 = cVar17.Begin._M_current;
      if (_Var9._M_current == local_2b0._M_current) break;
      arg_02._M_str = ((_Var9._M_current)->Value)._M_dataplus._M_p;
      arg_02._M_len = ((_Var9._M_current)->Value)._M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&uniqueName,arg_02,false);
      sVar2 = uniqueName._M_string_length;
      for (_Var14 = uniqueName._M_dataplus; _Var14._M_p != (pointer)sVar2;
          _Var14._M_p = _Var14._M_p + 0x20) {
        pcVar12 = cmTarget::GetFileSet(this->Target,(string *)_Var14._M_p);
        anon_unknown.dwarf_10fe8b8::addFileSetEntry(this,config,&dagChecker,pcVar12,&fileSetEntries)
        ;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&uniqueName);
      cVar17.End._M_current = local_2b0._M_current;
      cVar17.Begin._M_current = _Var9._M_current + 1;
    }
    cVar18 = cmTarget::GetCxxModuleHeaderSetsEntries_abi_cxx11_(this->Target);
    while( true ) {
      local_2b0 = cVar18.End._M_current;
      _Var9 = cVar18.Begin._M_current;
      if (_Var9._M_current == local_2b0._M_current) break;
      arg_03._M_str = ((_Var9._M_current)->Value)._M_dataplus._M_p;
      arg_03._M_len = ((_Var9._M_current)->Value)._M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&uniqueName,arg_03,false);
      sVar2 = uniqueName._M_string_length;
      for (_Var14 = uniqueName._M_dataplus; _Var14._M_p != (pointer)sVar2;
          _Var14._M_p = _Var14._M_p + 0x20) {
        pcVar12 = cmTarget::GetFileSet(this->Target,(string *)_Var14._M_p);
        anon_unknown.dwarf_10fe8b8::addFileSetEntry(this,config,&dagChecker,pcVar12,&fileSetEntries)
        ;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&uniqueName);
      cVar18.End._M_current = local_2b0._M_current;
      cVar18.Begin._M_current = _Var9._M_current + 1;
    }
    bVar7 = anon_unknown.dwarf_10fe8b8::processSources
                      (this,&fileSetEntries,__return_storage_ptr__,&uniqueSrcs,bVar7);
    if ((((bVar4) ||
         ((bVar5 && (local_1f0 <
                     (ulong)((long)(__return_storage_ptr__->
                                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(__return_storage_ptr__->
                                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start))))) ||
        ((bVar6 != false &&
         (local_1f8 <
          (ulong)((long)(__return_storage_ptr__->
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(__return_storage_ptr__->
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start))))) ||
       ((TVar13 = False, bVar7 &&
        (local_200 <
         (ulong)((long)(__return_storage_ptr__->
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(__return_storage_ptr__->
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start))))) {
      TVar13 = True;
    }
    this->SourcesAreContextDependent = TVar13;
    anon_unknown.dwarf_10fe8b8::EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
              (&fileSetEntries);
    anon_unknown.dwarf_10fe8b8::EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
              (&linkInterfaceSourcesEntries);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&uniqueSrcs._M_h);
    anon_unknown.dwarf_10fe8b8::EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
              (&entries);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&debugProperties);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetSourceFilePaths(
  std::string const& config) const
{
  std::vector<BT<std::string>> files;

  if (!this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026()) {
    // At configure-time, this method can be called as part of getting the
    // LOCATION property or to export() a file to be include()d.  However
    // there is no cmGeneratorTarget at configure-time, so search the SOURCES
    // for TARGET_OBJECTS instead for backwards compatibility with OLD
    // behavior of CMP0024 and CMP0026 only.

    cmBTStringRange sourceEntries = this->Target->GetSourceEntries();
    for (auto const& entry : sourceEntries) {
      std::vector<std::string> items = cmExpandedList(entry.Value);
      for (std::string const& item : items) {
        if (cmHasLiteralPrefix(item, "$<TARGET_OBJECTS:") &&
            item.back() == '>') {
          continue;
        }
        files.emplace_back(item);
      }
    }
    return files;
  }

  std::vector<std::string> debugProperties;
  this->Makefile->GetDefExpandList("CMAKE_DEBUG_TARGET_PROPERTIES",
                                   debugProperties);

  bool debugSources =
    !this->DebugSourcesDone && cm::contains(debugProperties, "SOURCES");

  if (this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026()) {
    this->DebugSourcesDone = true;
  }

  cmGeneratorExpressionDAGChecker dagChecker(this, "SOURCES", nullptr,
                                             nullptr);

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, std::string(), &dagChecker, this->SourceEntries);

  std::unordered_set<std::string> uniqueSrcs;
  bool contextDependentDirectSources =
    processSources(this, entries, files, uniqueSrcs, debugSources);

  // Collect INTERFACE_SOURCES of all direct link-dependencies.
  EvaluatedTargetPropertyEntries linkInterfaceSourcesEntries;
  AddInterfaceEntries(this, config, "INTERFACE_SOURCES", std::string(),
                      &dagChecker, linkInterfaceSourcesEntries,
                      IncludeRuntimeInterface::No, LinkInterfaceFor::Usage);
  std::vector<std::string>::size_type numFilesBefore = files.size();
  bool contextDependentInterfaceSources = processSources(
    this, linkInterfaceSourcesEntries, files, uniqueSrcs, debugSources);

  // Collect TARGET_OBJECTS of direct object link-dependencies.
  bool contextDependentObjects = false;
  std::vector<std::string>::size_type numFilesBefore2 = files.size();
  if (this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    EvaluatedTargetPropertyEntries linkObjectsEntries;
    AddObjectEntries(this, config, &dagChecker, linkObjectsEntries);
    contextDependentObjects = processSources(this, linkObjectsEntries, files,
                                             uniqueSrcs, debugSources);
  }

  // Collect this target's file sets.
  std::vector<std::string>::size_type numFilesBefore3 = files.size();
  EvaluatedTargetPropertyEntries fileSetEntries;
  AddFileSetEntries(this, config, &dagChecker, fileSetEntries);
  bool contextDependentFileSets =
    processSources(this, fileSetEntries, files, uniqueSrcs, debugSources);

  // Determine if sources are context-dependent or not.
  if (!contextDependentDirectSources &&
      !(contextDependentInterfaceSources && numFilesBefore < files.size()) &&
      !(contextDependentObjects && numFilesBefore2 < files.size()) &&
      !(contextDependentFileSets && numFilesBefore3 < files.size())) {
    this->SourcesAreContextDependent = Tribool::False;
  } else {
    this->SourcesAreContextDependent = Tribool::True;
  }

  return files;
}